

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# softfloat.c
# Opt level: O1

floatx80 floatx80_mod_m68k(floatx80 a,floatx80 b,float_status *status)

{
  undefined1 auVar1 [12];
  int iVar2;
  int iVar3;
  byte bVar4;
  ulong uVar5;
  long lVar6;
  ulong uVar7;
  undefined4 uVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  ulong uVar13;
  ulong uVar14;
  bool bVar15;
  floatx80 fVar16;
  floatx80 fVar17;
  int32_t aExp;
  int32_t bExp;
  uint64_t bSig;
  uint64_t local_68;
  undefined4 local_5c;
  uint local_58;
  uint local_54;
  float_status *local_50;
  uint64_t local_48;
  ulong local_40;
  ulong local_38;
  
  local_48 = b.low;
  uVar12 = a._8_8_;
  fVar16.low = a.low;
  uVar9 = uVar12 & 0xffffffff;
  local_58 = a._8_4_ & 0x7fff;
  local_54 = b._8_4_ & 0x7fff;
  local_68 = fVar16.low;
  if ((~a._8_4_ & 0x7fff) == 0) {
    if ((((undefined1  [16])a & (undefined1  [16])0x7fffffffffffffff) == (undefined1  [16])0x0) &&
       (((undefined1  [16])b & (undefined1  [16])0x7fffffffffffffff) == (undefined1  [16])0x0 ||
        local_54 != 0x7fff)) {
LAB_006ef49e:
      float_raise_m68k('\x01',status);
      fVar16 = floatx80_default_nan_m68k(status);
      auVar1 = fVar16._0_12_;
    }
    else {
LAB_006ef2c3:
      fVar16._8_8_ = uVar12 & 0xffffffff;
      fVar16 = propagateFloatx80NaN_m68k(fVar16,b,status);
      auVar1 = fVar16._0_12_;
    }
  }
  else {
    if ((short)local_54 == 0) {
      if (local_48 == 0) goto LAB_006ef49e;
      normalizeFloatx80Subnormal_m68k(local_48,(int32_t *)&local_54,&local_48);
    }
    else if (local_54 == 0x7fff) {
      if (((undefined1  [16])b & (undefined1  [16])0x7fffffffffffffff) == (undefined1  [16])0x0)
      goto LAB_006ef656;
      goto LAB_006ef2c3;
    }
    if (local_58 == 0) {
      if ((local_68 & 0x7fffffffffffffff) == 0) goto LAB_006ef656;
      normalizeFloatx80Subnormal_m68k(local_68,(int32_t *)&local_58,&local_68);
    }
    uVar14 = local_48 | 0x8000000000000000;
    iVar2 = local_58 - local_54;
    if (iVar2 < 0) goto LAB_006ef656;
    if (uVar14 <= local_68) {
      local_68 = local_68 - uVar14;
    }
    uVar9 = (uVar12 & 0xffff) >> 0xf;
    iVar3 = iVar2 + -0x40;
    local_40 = local_48;
    uVar8 = (undefined4)uVar9;
    if (iVar2 < 0x41) {
      fVar16.low = 0;
    }
    else {
      uVar13 = uVar14 >> 0x20;
      uVar12 = local_48 & 0xffffffff00000000 | 0x8000000000000000;
      fVar16.low = 0;
      iVar2 = iVar3;
      do {
        uVar5 = 0xffffffffffffffff;
        if (local_68 < uVar14) {
          uVar10 = 0xffffffff00000000;
          if (local_68 < uVar12) {
            uVar10 = local_68 / uVar13 << 0x20;
          }
          uVar11 = (uVar10 >> 0x20) * (local_48 & 0xffffffff);
          uVar7 = uVar10 * uVar14;
          uVar5 = fVar16.low - uVar7;
          for (lVar6 = ((local_68 - ((uVar11 >> 0x20) + uVar13 * (uVar10 >> 0x20))) -
                       (ulong)(fVar16.low < uVar7)) - (ulong)(uVar7 < uVar11 << 0x20); lVar6 < 0;
              lVar6 = lVar6 + uVar13 + (ulong)bVar15) {
            uVar10 = uVar10 - 0x100000000;
            bVar15 = CARRY8(uVar5,local_48 << 0x20);
            uVar5 = uVar5 + (local_48 << 0x20);
          }
          uVar7 = uVar5 >> 0x20 | lVar6 << 0x20;
          uVar5 = 0xffffffff;
          if (uVar7 < uVar12) {
            uVar5 = uVar7 / uVar13;
          }
          uVar5 = uVar5 | uVar10;
        }
        uVar10 = 0;
        if (1 < uVar5) {
          uVar10 = uVar5 - 2;
        }
        lVar6 = (uVar10 & 0xffffffff) * uVar13 + (uVar10 >> 0x20) * (local_48 & 0xffffffff);
        uVar5 = uVar10 * uVar14;
        local_68 = (ulong)((((int)local_68 - (uint)(fVar16.low < uVar5)) -
                           ((int)((ulong)lVar6 >> 0x20) +
                           (int)(uVar10 >> 0x20) * (int)(uVar14 >> 0x20))) -
                          (uint)(uVar5 < (ulong)(lVar6 << 0x20))) << 0x3e | fVar16.low + -uVar5 >> 2
        ;
        fVar16.low = -uVar5 << 0x3e;
        iVar3 = iVar2 + -0x3e;
        bVar15 = 0x3e < iVar2;
        iVar2 = iVar3;
        local_5c = uVar8;
        local_50 = status;
        local_38 = (ulong)local_54;
      } while (bVar15);
    }
    if (-0x40 < iVar3) {
      uVar12 = 0xffffffffffffffff;
      if (local_68 < uVar14) {
        uVar10 = uVar14 >> 0x20;
        uVar5 = local_48 & 0xffffffff00000000 | 0x8000000000000000;
        uVar13 = 0xffffffff00000000;
        if (local_68 < uVar5) {
          uVar13 = local_68 / uVar10 << 0x20;
        }
        uVar11 = (local_48 & 0xffffffff) * (uVar13 >> 0x20);
        uVar7 = uVar13 * uVar14;
        uVar12 = fVar16.low - uVar7;
        lVar6 = ((local_68 - ((uVar11 >> 0x20) + (uVar13 >> 0x20) * uVar10)) -
                (ulong)(fVar16.low < uVar7)) - (ulong)(uVar7 < uVar11 << 0x20);
        if (lVar6 < 0) {
          do {
            uVar13 = uVar13 - 0x100000000;
            bVar15 = CARRY8(uVar12,local_48 << 0x20);
            uVar12 = uVar12 + (local_48 << 0x20);
            lVar6 = lVar6 + uVar10 + (ulong)bVar15;
          } while (lVar6 < 0);
        }
        uVar7 = uVar12 >> 0x20 | lVar6 << 0x20;
        uVar12 = 0xffffffff;
        if (uVar7 < uVar5) {
          uVar12 = uVar7 / uVar10;
        }
        uVar12 = uVar12 | uVar13;
        local_5c = uVar8;
        local_50 = status;
      }
      uVar5 = 0;
      uVar13 = uVar12 - 2;
      if (uVar12 < 2) {
        uVar13 = uVar5;
      }
      bVar4 = -(byte)iVar3;
      uVar13 = (uVar13 >> (bVar4 & 0x3f)) << (bVar4 & 0x3f);
      uVar10 = (local_48 & 0xffffffff) * (uVar13 >> 0x20);
      uVar7 = (uVar13 & 0xffffffff) * (uVar14 >> 0x20);
      uVar11 = uVar7 + uVar10;
      uVar12 = 0xffffffff00000000;
      if (!CARRY8(uVar7,uVar10)) {
        uVar12 = uVar5;
      }
      uVar10 = uVar13 * uVar14;
      bVar15 = fVar16.low < uVar10;
      fVar16.low = fVar16.low - uVar10;
      local_68 = (((local_68 - bVar15) - ((uVar11 >> 0x20) + (uVar13 >> 0x20) * (uVar14 >> 0x20))) +
                 uVar12) - (ulong)(uVar10 < uVar11 << 0x20);
      uVar13 = uVar14 << (bVar4 & 0x3f);
      uVar12 = uVar14 >> ((byte)iVar3 & 0x3f);
      if (iVar3 == 0) {
        uVar12 = uVar5;
      }
      if ((uVar12 < local_68) || (uVar13 <= fVar16.low && uVar12 == local_68)) {
        do {
          do {
            uVar5 = fVar16.low - uVar13;
            bVar15 = fVar16.low < uVar13;
            fVar16.low = fVar16.low - uVar13;
            local_68 = (local_68 - uVar12) - (ulong)bVar15;
          } while (uVar12 < local_68);
        } while (uVar13 <= uVar5 && uVar12 == local_68);
      }
    }
    local_48 = uVar14;
    fVar16 = normalizeRoundAndPackFloatx80_m68k
                       ('P',(flag)uVar9,iVar3 + local_54 + 0x40,local_68,fVar16.low,status);
    auVar1 = fVar16._0_12_;
  }
  fVar16.low = auVar1._0_8_;
  uVar9 = (ulong)auVar1._8_4_;
LAB_006ef656:
  fVar17._8_8_ = uVar9;
  fVar17.low = fVar16.low;
  return fVar17;
}

Assistant:

floatx80 floatx80_mod(floatx80 a, floatx80 b, float_status *status)
{
    flag aSign, zSign;
    int32_t aExp, bExp, expDiff;
    uint64_t aSig0, aSig1, bSig;
    uint64_t qTemp, term0, term1;

    aSig0 = extractFloatx80Frac(a);
    aExp = extractFloatx80Exp(a);
    aSign = extractFloatx80Sign(a);
    bSig = extractFloatx80Frac(b);
    bExp = extractFloatx80Exp(b);

    if (aExp == 0x7FFF) {
        if ((uint64_t) (aSig0 << 1)
            || ((bExp == 0x7FFF) && (uint64_t) (bSig << 1))) {
            return propagateFloatx80NaN(a, b, status);
        }
        goto invalid;
    }
    if (bExp == 0x7FFF) {
        if ((uint64_t) (bSig << 1)) {
            return propagateFloatx80NaN(a, b, status);
        }
        return a;
    }
    if (bExp == 0) {
        if (bSig == 0) {
        invalid:
            float_raise(float_flag_invalid, status);
            return floatx80_default_nan(status);
        }
        normalizeFloatx80Subnormal(bSig, &bExp, &bSig);
    }
    if (aExp == 0) {
        if ((uint64_t) (aSig0 << 1) == 0) {
            return a;
        }
        normalizeFloatx80Subnormal(aSig0, &aExp, &aSig0);
    }
    bSig |= UINT64_C(0x8000000000000000);
    zSign = aSign;
    expDiff = aExp - bExp;
    aSig1 = 0;
    if (expDiff < 0) {
        return a;
    }
    qTemp = (bSig <= aSig0);
    if (qTemp) {
        aSig0 -= bSig;
    }
    expDiff -= 64;
    while (0 < expDiff) {
        qTemp = estimateDiv128To64(aSig0, aSig1, bSig);
        qTemp = (2 < qTemp) ? qTemp - 2 : 0;
        mul64To128(bSig, qTemp, &term0, &term1);
        sub128(aSig0, aSig1, term0, term1, &aSig0, &aSig1);
        shortShift128Left(aSig0, aSig1, 62, &aSig0, &aSig1);
        expDiff -= 62;
    }
    expDiff += 64;
    if (0 < expDiff) {
        qTemp = estimateDiv128To64(aSig0, aSig1, bSig);
        qTemp = (2 < qTemp) ? qTemp - 2 : 0;
        qTemp >>= 64 - expDiff;
        mul64To128(bSig, qTemp << (64 - expDiff), &term0, &term1);
        sub128(aSig0, aSig1, term0, term1, &aSig0, &aSig1);
        shortShift128Left(0, bSig, 64 - expDiff, &term0, &term1);
        while (le128(term0, term1, aSig0, aSig1)) {
            ++qTemp;
            sub128(aSig0, aSig1, term0, term1, &aSig0, &aSig1);
        }
    }
    return
        normalizeRoundAndPackFloatx80(
            80, zSign, bExp + expDiff, aSig0, aSig1, status);
}